

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int propagateConstantExprRewrite(Walker *pWalker,Expr *pExpr)

{
  char *pcVar1;
  Expr *pEVar2;
  char *in_RSI;
  long in_RDI;
  Expr *pColumn;
  WhereConst *pConst;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int local_4;
  
  if (*in_RSI == -0x62) {
    if ((*(uint *)(in_RSI + 4) & 8) == 0) {
      pEVar2 = *(Expr **)(in_RDI + 0x28);
      for (iVar3 = 0; iVar3 < (pEVar2->u).iValue; iVar3 = iVar3 + 1) {
        pcVar1 = *(char **)(&pEVar2->pLeft->op + (long)(iVar3 << 1) * 8);
        if (((pcVar1 != in_RSI) && (*(int *)(pcVar1 + 0x2c) == *(int *)(in_RSI + 0x2c))) &&
           (*(short *)(pcVar1 + 0x30) == *(short *)(in_RSI + 0x30))) {
          *(int *)((long)&pEVar2->u + 4) = *(int *)((long)&pEVar2->u + 4) + 1;
          *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) & 0xff7fffff;
          *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 8;
          pEVar2 = sqlite3ExprDup((sqlite3 *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),pEVar2,
                                  (int)((ulong)pcVar1 >> 0x20));
          *(Expr **)(in_RSI + 0x10) = pEVar2;
          break;
        }
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int propagateConstantExprRewrite(Walker *pWalker, Expr *pExpr){
  int i;
  WhereConst *pConst;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  if( ExprHasProperty(pExpr, EP_FixedCol) ) return WRC_Continue;
  pConst = pWalker->u.pConst;
  for(i=0; i<pConst->nConst; i++){
    Expr *pColumn = pConst->apExpr[i*2];
    if( pColumn==pExpr ) continue;
    if( pColumn->iTable!=pExpr->iTable ) continue;
    if( pColumn->iColumn!=pExpr->iColumn ) continue;
    /* A match is found.  Add the EP_FixedCol property */
    pConst->nChng++;
    ExprClearProperty(pExpr, EP_Leaf);
    ExprSetProperty(pExpr, EP_FixedCol);
    assert( pExpr->pLeft==0 );
    pExpr->pLeft = sqlite3ExprDup(pConst->pParse->db, pConst->apExpr[i*2+1], 0);
    break;
  }
  return WRC_Prune;
}